

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

void density_tests::detail::
     single_queue_generic_test<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
               (QueueTesterFlags i_flags,ostream *i_output,EasyRandom *i_random,
               size_t i_element_count,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *i_thread_count_vector)

{
  bool bVar1;
  reference puVar2;
  QueueGenericTester<density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
  local_f8 [8];
  QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>
  tester;
  unsigned_long thread_count;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *i_thread_count_vector_local;
  size_t i_element_count_local;
  EasyRandom *i_random_local;
  ostream *i_output_local;
  QueueTesterFlags i_flags_local;
  
  __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(i_thread_count_vector);
  thread_count = (unsigned_long)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           (i_thread_count_vector);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&thread_count);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end2);
    tester.m_thread_count = *puVar2;
    QueueGenericTester<density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
    ::QueueGenericTester(local_f8,i_output,tester.m_thread_count);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
    ::
    add_test_case<density_tests::detail::PutInt<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>>
              ((QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
                *)local_f8);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
    ::
    add_test_case<density_tests::detail::PutUInt8<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>>
              ((QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
                *)local_f8);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
    ::
    add_test_case<density_tests::detail::PutUInt16<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>>
              ((QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
                *)local_f8);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
    ::
    add_test_case<density_tests::detail::PutString<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>>
              ((QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
                *)local_f8);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
    ::
    add_test_case<density_tests::detail::PutTestObject<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>,128ul,8ul>>
              ((QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
                *)local_f8);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
    ::
    add_test_case<density_tests::detail::PutTestObject<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>,256ul,128ul>>
              ((QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
                *)local_f8);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
    ::
    add_test_case<density_tests::detail::PutTestObject<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>,2048ul,2048ul>>
              ((QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
                *)local_f8);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
    ::
    add_test_case<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>>
              ((QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
                *)local_f8);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
    ::
    add_test_case<density_tests::detail::ReentrantPush<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>>
              ((QueueGenericTester<density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>>
                *)local_f8);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
    ::run(local_f8,i_flags,i_random,i_element_count);
    QueueGenericTester<density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
    ::~QueueGenericTester(local_f8);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void single_queue_generic_test(
          QueueTesterFlags    i_flags,
          std::ostream &      i_output,
          EasyRandom &        i_random,
          size_t              i_element_count,
          std::vector<size_t> i_thread_count_vector)
        {
            for (auto thread_count : i_thread_count_vector)
            {
                QueueGenericTester<QUEUE> tester(i_output, thread_count);
                tester.template add_test_case<PutInt<QUEUE>>();
                tester.template add_test_case<PutUInt8<QUEUE>>();
                tester.template add_test_case<PutUInt16<QUEUE>>();
                tester.template add_test_case<PutString<QUEUE>>();
                tester.template add_test_case<PutTestObject<QUEUE, 128, 8>>();
                tester.template add_test_case<PutTestObject<QUEUE, 256, 128>>();
                tester.template add_test_case<PutTestObject<QUEUE, 2048, 2048>>();
                tester.template add_test_case<PutRawBlocks<QUEUE>>();
                tester.template add_test_case<ReentrantPush<QUEUE>>();

                tester.run(i_flags, i_random, i_element_count);
            }
        }